

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int read_inplace(void *buf,uint64_t element_size,uint64_t element_count,trico_archive *arch)

{
  if ((*(int *)(element_size + 0x40) == 0) &&
     ((ulong)((long)*(undefined4 **)(element_size + 0x18) + (4 - *(long *)(element_size + 0x10))) <=
      *(ulong *)(element_size + 0x30))) {
    *(undefined4 *)buf = **(undefined4 **)(element_size + 0x18);
    return 1;
  }
  return 0;
}

Assistant:

static int read_inplace(void* buf, uint64_t element_size, uint64_t element_count, struct trico_archive* arch)
  {
  if (arch->writable)
    return 0;
  uint64_t sz = element_size * element_count;
  uint64_t data_read = arch->data_pointer - arch->data;
  if ((data_read + sz) > arch->data_size)
    return 0;
  memcpy(buf, arch->data_pointer, sz);
  return 1;
  }